

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result_conflict1 __thiscall
testing::internal::
FunctionMocker<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
::PerformDefaultAction
          (FunctionMocker<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
           *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  Action<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *this_01;
  string message;
  long *local_60 [2];
  long local_50 [2];
  ArgumentTuple local_40;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
                 *)0x0;
      break;
    }
    this_01 = (OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
               *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    bVar2 = OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
            ::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 ==
      (OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
       *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_60);
    if (DefaultValue<int>::producer_ == (long *)0x0) {
      RVar3 = 0;
    }
    else {
      RVar3 = (**(code **)(*DefaultValue<int>::producer_ + 0x10))();
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
              ::GetAction(this_01);
    local_40.
    super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>
    .super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>._M_head_impl
         = (_Head_base<1UL,_unsigned_char,_false>)
           (args->
           super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>
           ).super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>.
           _M_head_impl;
    local_40.
    super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>
    .
    super__Head_base<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_false>
    ._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>
         ).
         super__Head_base<0UL,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_false>
         ._M_head_impl;
    RVar3 = Action<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
            ::Perform(this_00,&local_40);
  }
  return RVar3;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }